

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall sing::HttpServer::start(HttpServer *this)

{
  TimerManager *pTVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  HttpContext *this_00;
  _Head_base<1UL,_sing::HttpContext_*,_false> context;
  ThreadPool *this_01;
  int iVar6;
  int index;
  _Any_data local_70;
  HttpContext *local_60;
  HttpServer *local_58;
  _Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
  local_50;
  
  this_00 = (HttpContext *)operator_new(0x288);
  HttpContext::HttpContext(this_00,this->listenfd);
  bVar2 = Epoll::addFd((this->epoller)._M_t.
                       super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>._M_t.
                       super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>.
                       super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,this->listenfd,
                       this_00,0x80000001);
  if (!bVar2) {
    __assert_fail("epoller->addFd(listenfd, listenContext, (EPOLLIN | EPOLLET))==true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Http/HttpServer.cpp"
                  ,0x23,"void sing::HttpServer::start()");
  }
  do {
    uVar3 = TimerManager::getNextTimeout
                      ((this->timerManager)._M_t.
                       super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                       .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl);
    iVar4 = Epoll::wait((this->epoller)._M_t.
                        super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>._M_t.
                        super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>.
                        super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,
                        (void *)(ulong)uVar3);
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (index = 0; iVar4 != index; index = index + 1) {
      context._M_head_impl =
           Epoll::getDataPtr((this->epoller)._M_t.
                             super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>
                             .super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,index);
      uVar5 = Epoll::getEvents((this->epoller)._M_t.
                               super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>
                               .super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,index);
      if ((context._M_head_impl)->fd == this->listenfd) {
        acceptConnection(this);
      }
      else if ((uVar5 & 0x2018) == 0) {
        if ((uVar5 & 1) == 0) {
          if ((uVar5 & 4) == 0) {
            syslog(0x20,"Epoll: Unexpected event");
            goto LAB_00111bd0;
          }
          bVar2 = HttpRequest::keepAlive(&(context._M_head_impl)->request);
          iVar6 = 300000;
          if (!bVar2) {
            iVar6 = this->timeout;
          }
          pTVar1 = (this->timerManager)._M_t.
                   super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                   .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl;
          local_50._M_f = (offset_in_HttpServer_to_subr)closeConnection;
          local_50._8_8_ = 0;
          local_50._M_bound_args.super__Tuple_impl<0UL,_sing::HttpServer_*,_sing::HttpContext_*>.
          super__Tuple_impl<1UL,_sing::HttpContext_*>.
          super__Head_base<1UL,_sing::HttpContext_*,_false>._M_head_impl =
               (_Head_base<1UL,_sing::HttpContext_*,_false>)
               (_Head_base<1UL,_sing::HttpContext_*,_false>)context._M_head_impl;
          local_50._M_bound_args.super__Tuple_impl<0UL,_sing::HttpServer_*,_sing::HttpContext_*>.
          super__Head_base<0UL,_sing::HttpServer_*,_false>._M_head_impl = this;
          std::function<void()>::
          function<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>,void>
                    ((function<void()> *)local_70._M_pod_data,&local_50);
          TimerManager::addTimer(pTVar1,context._M_head_impl,iVar6,(function<void_()> *)&local_70);
          std::_Function_base::~_Function_base((_Function_base *)&local_70);
          this_01 = (this->threadPool)._M_t.
                    super___uniq_ptr_impl<sing::ThreadPool,_std::default_delete<sing::ThreadPool>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_sing::ThreadPool_*,_std::default_delete<sing::ThreadPool>_>
                    .super__Head_base<0UL,_sing::ThreadPool_*,_false>._M_head_impl;
          local_70._M_unused._M_object = doResponse;
        }
        else {
          bVar2 = HttpRequest::keepAlive(&(context._M_head_impl)->request);
          iVar6 = 300000;
          if (!bVar2) {
            iVar6 = this->timeout;
          }
          pTVar1 = (this->timerManager)._M_t.
                   super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                   .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl;
          local_50._M_f = (offset_in_HttpServer_to_subr)closeConnection;
          local_50._8_8_ = 0;
          local_50._M_bound_args.super__Tuple_impl<0UL,_sing::HttpServer_*,_sing::HttpContext_*>.
          super__Tuple_impl<1UL,_sing::HttpContext_*>.
          super__Head_base<1UL,_sing::HttpContext_*,_false>._M_head_impl =
               (_Head_base<1UL,_sing::HttpContext_*,_false>)
               (_Head_base<1UL,_sing::HttpContext_*,_false>)context._M_head_impl;
          local_50._M_bound_args.super__Tuple_impl<0UL,_sing::HttpServer_*,_sing::HttpContext_*>.
          super__Head_base<0UL,_sing::HttpServer_*,_false>._M_head_impl = this;
          std::function<void()>::
          function<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>,void>
                    ((function<void()> *)local_70._M_pod_data,&local_50);
          TimerManager::addTimer(pTVar1,context._M_head_impl,iVar6,(function<void_()> *)&local_70);
          std::_Function_base::~_Function_base((_Function_base *)&local_70);
          this_01 = (this->threadPool)._M_t.
                    super___uniq_ptr_impl<sing::ThreadPool,_std::default_delete<sing::ThreadPool>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_sing::ThreadPool_*,_std::default_delete<sing::ThreadPool>_>
                    .super__Head_base<0UL,_sing::ThreadPool_*,_false>._M_head_impl;
          local_70._M_unused._M_object = doRequest;
        }
        local_70._8_8_ = 0;
        local_60 = context._M_head_impl;
        local_58 = this;
        ThreadPool::
        pushTask<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
                  (this_01,(_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
                            *)&local_70);
      }
      else {
        closeConnection(this,context._M_head_impl);
      }
LAB_00111bd0:
    }
    TimerManager::tick((this->timerManager)._M_t.
                       super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                       .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl);
  } while( true );
}

Assistant:

void HttpServer::start(){
    HttpContext *listenContext = new HttpContext(listenfd);
    assert(epoller->addFd(listenfd, listenContext, (EPOLLIN | EPOLLET))==true);

    int timeMs;
    while (1)
    {
        timeMs = timerManager->getNextTimeout();
        int ev_num = epoller->wait(timeMs);
        for (int i = 0; i < ev_num; ++i)
        {
            HttpContext* context = epoller->getDataPtr(i); //maybe NULL
            uint32_t events = epoller->getEvents(i);
            int fd = context->getFd();

            if(fd==listenfd){
                acceptConnection();
            }
            else if(events & (EPOLLRDHUP | EPOLLHUP | EPOLLERR)){
                closeConnection(context);
            }
            else if(events & EPOLLIN){
                int t = context->keepAlive() ? 5*60*1000 : timeout;
                timerManager->addTimer(context, t, std::bind(&HttpServer::closeConnection, this, context));
                threadPool->pushTask(std::bind(&HttpServer::doRequest, this, context));
            }
            else if(events & EPOLLOUT){
                int t = context->keepAlive() ? 5*60*1000 : timeout;
                timerManager->addTimer(context, t, std::bind(&HttpServer::closeConnection, this, context));
                threadPool->pushTask(std::bind(&HttpServer::doResponse, this, context));
            }
            else{
                syslog(LOG_PERROR, "Epoll: Unexpected event");
            }
        }
        timerManager->tick();
    }
}